

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_> * __thiscall
bk_lib::pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>::
operator=(pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
          *this,pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                *other)

{
  PredType *first;
  
  if (this != other) {
    first = (other->ebo_).buf;
    pod_vector<Clasp::OutputTable::PredType,std::allocator<Clasp::OutputTable::PredType>>::
    assign<Clasp::OutputTable::PredType_const*>
              ((pod_vector<Clasp::OutputTable::PredType,std::allocator<Clasp::OutputTable::PredType>>
                *)this,first,first + (other->ebo_).size);
  }
  return this;
}

Assistant:

pod_vector& operator=(const pod_vector& other) {
		if (this != &other) {
			assign(other.begin(), other.end());
		}
		return *this;
	}